

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryAnimationsLoader14.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryAnimationsLoader14::begin__sampler(LibraryAnimationsLoader14 *this)

{
  undefined8 *in_RSI;
  sampler__AttributeData attrData;
  sampler__AttributeData local_10;
  
  local_10.id = (ParserChar *)*in_RSI;
  local_10.pre_behavior = ENUM__sampler_behavior__NOT_PRESENT;
  local_10.post_behavior = ENUM__sampler_behavior__NOT_PRESENT;
  LibraryAnimationsLoader::begin__sampler
            ((LibraryAnimationsLoader *)
             (this->super_SourceArrayLoader14).super_IParserImpl14.super_ColladaParserAutoGen14.
             _vptr_ColladaParserAutoGen14,&local_10);
  return;
}

Assistant:

bool LibraryAnimationsLoader14::begin__sampler( const COLLADASaxFWL14::sampler__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__sampler(attributeData));
COLLADASaxFWL::sampler__AttributeData attrData;
attrData.id = attributeData.id;
attrData.pre_behavior = COLLADASaxFWL::ENUM__sampler_behavior__NOT_PRESENT;
attrData.post_behavior = COLLADASaxFWL::ENUM__sampler_behavior__NOT_PRESENT;
return mLoader->begin__sampler(attrData);
}